

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PLYReader.cc
# Opt level: O3

ssize_t __thiscall
OpenMesh::IO::_PLYReader_::read(_PLYReader_ *this,int __fd,void *__buf,size_t __nbytes)

{
  char cVar1;
  uint uVar2;
  mostream *pmVar3;
  ostream *poVar4;
  ulong uVar5;
  undefined4 in_register_00000034;
  undefined8 *puVar6;
  long local_238;
  fstream in;
  int aiStack_218 [124];
  
  puVar6 = (undefined8 *)CONCAT44(in_register_00000034,__fd);
  std::fstream::fstream(&local_238,(char *)*puVar6,_S_in|_S_bin);
  cVar1 = std::__basic_file<char>::is_open();
  if ((cVar1 == '\0') || (*(int *)((long)aiStack_218 + *(long *)(local_238 + -0x18)) != 0)) {
    pmVar3 = omerr();
    std::__ostream_insert<char,std::char_traits<char>>
              (&pmVar3->super_ostream,"[PLYReader] : cannot not open file ",0x23);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (&pmVar3->super_ostream,(char *)*puVar6,puVar6[1]);
    std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    uVar5 = 0;
  }
  else {
    uVar2 = (*(this->super_BaseReader)._vptr_BaseReader[6])(this,&local_238,__buf,__nbytes);
    uVar5 = (ulong)uVar2;
    std::fstream::close();
  }
  std::fstream::~fstream(&local_238);
  return uVar5;
}

Assistant:

bool _PLYReader_::read(const std::string& _filename, BaseImporter& _bi, Options& _opt) {

    std::fstream in(_filename.c_str(), (std::ios_base::binary | std::ios_base::in) );

    if (!in.is_open() || !in.good()) {
        omerr() << "[PLYReader] : cannot not open file " << _filename << std::endl;
        return false;
    }

    bool result = read(in, _bi, _opt);

    in.close();
    return result;
}